

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

bool __thiscall CppUnit::Test::findTestPath(Test *this,string *testName,TestPath *testPath)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  (*this->_vptr_Test[6])(&local_50,this);
  if (local_48 == testName->_M_string_length) {
    if (local_48 == 0) {
      bVar6 = true;
    }
    else {
      iVar2 = bcmp(local_50,(testName->_M_dataplus)._M_p,local_48);
      bVar6 = iVar2 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (bVar6) {
    (*testPath->_vptr_TestPath[3])(testPath,this);
LAB_00129369:
    bVar6 = true;
  }
  else {
    uVar3 = (*this->_vptr_Test[4])(this);
    bVar6 = 0 < (int)uVar3;
    if (0 < (int)uVar3) {
      uVar5 = 0;
      do {
        iVar2 = (*this->_vptr_Test[5])(this,uVar5);
        cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
                          ((long *)CONCAT44(extraout_var,iVar2),testName,testPath);
        if (cVar1 != '\0') {
          (*testPath->_vptr_TestPath[5])(testPath,this,0);
          goto LAB_00129369;
        }
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar3 != uVar4);
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool 
Test::findTestPath( const std::string &testName,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( getName() == testName )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( testName, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}